

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGBT,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  uint uVar6;
  int iVar7;
  BYTE BVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  BYTE BVar16;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar10 = 0;
      do {
        BVar8 = 0xff;
        if ((pbVar9[-2] == tr) && (pbVar9[-1] == tg)) {
          BVar8 = -(*pbVar9 != tb);
        }
        if (BVar8 != '\0') {
          iVar13 = (int)((uint)pbVar9[-2] * inf->alpha + (uint)pout[lVar10 * 4 + 2] * 0x10000) >>
                   0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)((uint)pbVar9[-1] * inf->alpha + (uint)pout[lVar10 * 4 + 1] * 0x10000) >>
                   0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)((uint)*pbVar9 * inf->alpha + (uint)pout[lVar10 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4] = (BYTE)iVar13;
          pout[lVar10 * 4 + 3] = BVar8;
        }
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar10);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar10 = 0;
      do {
        BVar8 = 0xff;
        if ((pbVar9[-2] == tr) && (pbVar9[-1] == tg)) {
          BVar8 = -(*pbVar9 != tb);
        }
        if (BVar8 != '\0') {
          uVar6 = (uint)pbVar9[-1] * 0x8f + (uint)pbVar9[-2] * 0x4d +
                  ((uint)*pbVar9 + (uint)*pbVar9 * 8) * 4 >> 0xc;
          iVar13 = (uint)IcePalette[uVar6][0] * inf->alpha + (uint)pout[lVar10 * 4 + 2] * 0x10000;
          BVar16 = (BYTE)((uint)iVar13 >> 0x10);
          if (0xfe < iVar13 >> 0x10) {
            BVar16 = 0xff;
          }
          pout[lVar10 * 4 + 2] = BVar16;
          iVar13 = (uint)IcePalette[uVar6][1] * inf->alpha + (uint)pout[lVar10 * 4 + 1] * 0x10000;
          BVar16 = (BYTE)((uint)iVar13 >> 0x10);
          if (0xfe < iVar13 >> 0x10) {
            BVar16 = 0xff;
          }
          pout[lVar10 * 4 + 1] = BVar16;
          iVar13 = (uint)IcePalette[uVar6][2] * inf->alpha + (uint)pout[lVar10 * 4] * 0x10000;
          BVar16 = (BYTE)((uint)iVar13 >> 0x10);
          if (0xfe < iVar13 >> 0x10) {
            BVar16 = 0xff;
          }
          pout[lVar10 * 4] = BVar16;
          pout[lVar10 * 4 + 3] = BVar8;
        }
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar10);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar10 = 0;
      do {
        BVar8 = 0xff;
        if ((pbVar9[-2] == tr) && (pbVar9[-1] == tg)) {
          BVar8 = -(*pbVar9 != tb);
        }
        if (BVar8 != '\0') {
          iVar13 = inf->blendcolor[3];
          iVar7 = (int)(((uint)pbVar9[-2] * iVar13 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha
                       + (uint)pout[lVar10 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          bVar1 = pbVar9[-1];
          iVar11 = inf->blendcolor[1];
          bVar2 = *pbVar9;
          iVar14 = inf->blendcolor[2];
          pout[lVar10 * 4 + 2] = (BYTE)iVar7;
          iVar7 = (int)(((uint)bVar1 * iVar13 + iVar11 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar10 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          pout[lVar10 * 4 + 1] = (BYTE)iVar7;
          iVar13 = (int)(((uint)bVar2 * iVar13 + iVar14 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar10 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4] = (BYTE)iVar13;
          pout[lVar10 * 4 + 3] = BVar8;
        }
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar10);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar9 = pin + 2;
      lVar10 = 0;
      do {
        BVar8 = 0xff;
        if ((pbVar9[-2] == tr) && (pbVar9[-1] == tg)) {
          BVar8 = -(*pbVar9 != tb);
        }
        if (BVar8 != '\0') {
          iVar13 = (int)(((uint)pbVar9[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar10 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          bVar1 = pbVar9[-1];
          iVar7 = inf->blendcolor[1];
          bVar2 = *pbVar9;
          iVar11 = inf->blendcolor[2];
          pout[lVar10 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)(((uint)bVar1 * iVar7 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar10 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)(((uint)bVar2 * iVar11 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar10 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar10 * 4] = (BYTE)iVar13;
          pout[lVar10 * 4 + 3] = BVar8;
        }
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar10);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar10 = (long)EVar5;
    if (lVar10 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar13 = 0x20 - EVar5;
        pbVar9 = pin + 2;
        lVar10 = 0;
        do {
          bVar1 = pbVar9[-2];
          BVar8 = 0xff;
          if ((bVar1 == tr) && (pbVar9[-1] == tg)) {
            BVar8 = -(*pbVar9 != tb);
          }
          if (BVar8 != '\0') {
            bVar2 = *pbVar9;
            iVar7 = ((uint)pbVar9[-1] * 0x8f + (uint)bVar1 * 0x4d +
                     ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
            iVar11 = (uint)bVar1 * iVar13 + iVar7;
            iVar14 = (uint)pbVar9[-1] * iVar13 + iVar7;
            iVar7 = (uint)bVar2 * iVar13 + iVar7;
            iVar11 = ((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) - (iVar11 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar10 * 4 + 2] * 0x10000;
            BVar16 = (BYTE)((uint)iVar11 >> 0x10);
            if (0xfe < iVar11 >> 0x10) {
              BVar16 = 0xff;
            }
            pout[lVar10 * 4 + 2] = BVar16;
            iVar11 = ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar10 * 4 + 1] * 0x10000;
            BVar16 = (BYTE)((uint)iVar11 >> 0x10);
            if (0xfe < iVar11 >> 0x10) {
              BVar16 = 0xff;
            }
            pout[lVar10 * 4 + 1] = BVar16;
            iVar7 = ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar10 * 4] * 0x10000;
            BVar16 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar16 = 0xff;
            }
            pout[lVar10 * 4] = BVar16;
            pout[lVar10 * 4 + 3] = BVar8;
          }
          lVar10 = lVar10 + 1;
          pbVar9 = pbVar9 + step;
        } while (count != (int)lVar10);
      }
    }
    else if (0 < count) {
      pbVar9 = pin + 2;
      lVar15 = 0;
      do {
        BVar8 = 0xff;
        if ((pbVar9[-2] == tr) && (pbVar9[-1] == tg)) {
          BVar8 = -(*pbVar9 != tb);
        }
        if (BVar8 != '\0') {
          uVar6 = (uint)pbVar9[-1] * 0x8f + (uint)pbVar9[-2] * 0x4d +
                  ((uint)*pbVar9 + (uint)*pbVar9 * 8) * 4;
          uVar3 = uVar6 >> 8;
          uVar12 = (ulong)uVar3;
          if (0xfe < uVar3) {
            uVar12 = 0xff;
          }
          if (uVar6 < 0x100) {
            uVar12 = 0;
          }
          iVar13 = (int)((uint)*(byte *)((long)pFVar4 + uVar12 * 4 + lVar10 * 0x518 + -0xa6fe) *
                         inf->alpha + (uint)pout[lVar15 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          bVar1 = *(byte *)((long)pFVar4 + uVar12 * 4 + lVar10 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar4 + uVar12 * 4 + lVar10 * 0x518 + -0xa6ff);
          pout[lVar15 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar15 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar15 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar15 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar15 * 4] = (BYTE)iVar13;
          pout[lVar15 * 4 + 3] = BVar8;
        }
        lVar15 = lVar15 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar15);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}